

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFun.cpp
# Opt level: O1

double Imath_3_2::succd(double d)

{
  double dVar1;
  
  if (0x7fefffffffffffff < (ulong)ABS(d)) {
    return d;
  }
  dVar1 = nextafter(d,INFINITY);
  return dVar1;
}

Assistant:

double succd(double d) IMATH_NOEXCEPT
{
    return std::isfinite(d) ?
            std::nextafter(d, std::numeric_limits<double>::infinity()) : d;
}